

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void destStore64Gray16(QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *buffer,int length)

{
  long lVar1;
  bool bVar2;
  quint16 qVar3;
  uchar *puVar4;
  unsigned_short *dst;
  QColorTransformPrivate *this;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QColorTransformPrivate *tfd;
  int k;
  bool failed;
  quint16 *data;
  QColorTransform tf;
  QColorSpace fromCS;
  undefined4 in_stack_ffffffffffffff78;
  TransformFlag in_stack_ffffffffffffff7c;
  QColorSpace *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffffa0;
  NamedColorSpace in_stack_ffffffffffffffa4;
  QColorSpace *in_stack_ffffffffffffffa8;
  int iVar5;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  QFlagsStorage<QColorTransformPrivate::TransformFlag> flags;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = QRasterBuffer::scanLine(in_RDI,in_EDX);
  dst = (unsigned_short *)(puVar4 + (long)in_ESI * 2);
  in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
  iVar5 = 0;
  do {
    flags.i = (Int)((ulong)in_RDI >> 0x20);
    if (in_R8D <= iVar5) {
LAB_00b718ec:
      if ((in_stack_ffffffffffffffb4 & 0x1000000) != 0) {
        bVar2 = QColorSpace::isValid
                          ((QColorSpace *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        if (bVar2) {
          QColorSpace::QColorSpace
                    (in_stack_ffffffffffffff80,
                     (QColorSpace *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
        else {
          QColorSpace::QColorSpace(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
        }
        QColorSpacePrivate::get((QColorSpace *)0xb71951);
        QColorSpacePrivate::transformationToXYZ
                  ((QColorSpacePrivate *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        this = QColorTransformPrivate::get((QColorTransform *)0xb71968);
        QFlags<QColorTransformPrivate::TransformFlag>::QFlags
                  ((QFlags<QColorTransformPrivate::TransformFlag> *)this,in_stack_ffffffffffffff7c);
        QColorTransformPrivate::apply<unsigned_short,QRgba64>
                  ((QColorTransformPrivate *)CONCAT44(in_R8D,in_stack_ffffffffffffffc0),dst,
                   (QRgba64 *)CONCAT44(in_stack_ffffffffffffffb4,iVar5),(qsizetype)this,
                   (TransformFlags)flags.i);
        QColorTransform::~QColorTransform((QColorTransform *)0xb719cc);
        QColorSpace::~QColorSpace((QColorSpace *)0xb719d6);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    qVar3 = QRgba64::red((QRgba64 *)(in_RCX + (long)iVar5 * 8));
    in_stack_ffffffffffffffa4 = (NamedColorSpace)qVar3;
    qVar3 = QRgba64::green((QRgba64 *)(in_RCX + (long)iVar5 * 8));
    flags.i = (Int)((ulong)in_RDI >> 0x20);
    if (in_stack_ffffffffffffffa4 != qVar3) {
LAB_00b718ae:
      in_stack_ffffffffffffffb4 = CONCAT13(1,(int3)in_stack_ffffffffffffffb4);
      goto LAB_00b718ec;
    }
    qVar3 = QRgba64::red((QRgba64 *)(in_RCX + (long)iVar5 * 8));
    in_stack_ffffffffffffffa0 = (uint)qVar3;
    qVar3 = QRgba64::blue((QRgba64 *)(in_RCX + (long)iVar5 * 8));
    flags.i = (Int)((ulong)in_RDI >> 0x20);
    if (in_stack_ffffffffffffffa0 != qVar3) goto LAB_00b718ae;
    qVar3 = QRgba64::red((QRgba64 *)(in_RCX + (long)iVar5 * 8));
    dst[iVar5] = qVar3;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static void QT_FASTCALL destStore64Gray16(QRasterBuffer *rasterBuffer, int x, int y, const QRgba64 *buffer, int length)
{
    quint16 *data = reinterpret_cast<quint16 *>(rasterBuffer->scanLine(y)) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (buffer[k].red() != buffer[k].green() || buffer[k].red() != buffer[k].blue()) {
            failed = true;
            break;
        }
        data[k] = buffer[k].red();
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);
        tfd->apply(data, buffer, length, QColorTransformPrivate::InputPremultiplied);
    }
}